

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

void Gia_ManAreDeriveCexSat(Gia_ManAre_t *p,Gia_StaAre_t *pCur,Gia_StaAre_t *pNext,int iOutFailed)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *pVVar2;
  sat_solver *psVar3;
  int iVar4;
  int *begin;
  int *piVar5;
  int local_28;
  int status;
  int i;
  int iOutFailed_local;
  Gia_StaAre_t *pNext_local;
  Gia_StaAre_t *pCur_local;
  Gia_ManAre_t *p_local;
  
  Vec_IntClear(p->vAssumps);
  for (local_28 = 0; iVar4 = Gia_ManRegNum(p->pAig), local_28 < iVar4; local_28 = local_28 + 1) {
    iVar4 = Gia_StaHasValue0(pCur,local_28);
    if (iVar4 == 0) {
      iVar4 = Gia_StaHasValue1(pCur,local_28);
      if (iVar4 != 0) {
        pVVar1 = p->vAssumps;
        pVVar2 = p->vSatNumCis;
        iVar4 = Gia_ManPiNum(p->pAig);
        iVar4 = Vec_IntEntry(pVVar2,iVar4 + local_28);
        iVar4 = Abc_Var2Lit(iVar4,0);
        Vec_IntPush(pVVar1,iVar4);
      }
    }
    else {
      pVVar1 = p->vAssumps;
      pVVar2 = p->vSatNumCis;
      iVar4 = Gia_ManPiNum(p->pAig);
      iVar4 = Vec_IntEntry(pVVar2,iVar4 + local_28);
      iVar4 = Abc_Var2Lit(iVar4,1);
      Vec_IntPush(pVVar1,iVar4);
    }
  }
  if (pNext != (Gia_StaAre_t *)0x0) {
    for (local_28 = 0; iVar4 = Gia_ManRegNum(p->pAig), local_28 < iVar4; local_28 = local_28 + 1) {
      iVar4 = Gia_StaHasValue0(pNext,local_28);
      if (iVar4 == 0) {
        iVar4 = Gia_StaHasValue1(pNext,local_28);
        if (iVar4 != 0) {
          pVVar1 = p->vAssumps;
          pVVar2 = p->vSatNumCos;
          iVar4 = Gia_ManPoNum(p->pAig);
          iVar4 = Vec_IntEntry(pVVar2,iVar4 + local_28);
          iVar4 = Abc_Var2Lit(iVar4,0);
          Vec_IntPush(pVVar1,iVar4);
        }
      }
      else {
        pVVar1 = p->vAssumps;
        pVVar2 = p->vSatNumCos;
        iVar4 = Gia_ManPoNum(p->pAig);
        iVar4 = Vec_IntEntry(pVVar2,iVar4 + local_28);
        iVar4 = Abc_Var2Lit(iVar4,1);
        Vec_IntPush(pVVar1,iVar4);
      }
    }
  }
  if (-1 < iOutFailed) {
    iVar4 = Gia_ManPoNum(p->pAig);
    if (iVar4 <= iOutFailed) {
      __assert_fail("iOutFailed < Gia_ManPoNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                    ,0x752,
                    "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                   );
    }
    pVVar1 = p->vAssumps;
    iVar4 = Vec_IntEntry(p->vSatNumCos,iOutFailed);
    iVar4 = Abc_Var2Lit(iVar4,0);
    Vec_IntPush(pVVar1,iVar4);
  }
  psVar3 = (sat_solver *)p->pSat;
  begin = Vec_IntArray(p->vAssumps);
  piVar5 = Vec_IntArray(p->vAssumps);
  iVar4 = Vec_IntSize(p->vAssumps);
  iVar4 = sat_solver_solve(psVar3,begin,piVar5 + iVar4,1000000,0,0,0);
  if (iVar4 == 1) {
    Vec_IntClear(p->vCofVars);
    for (local_28 = 0; iVar4 = Gia_ManPiNum(p->pAig), local_28 < iVar4; local_28 = local_28 + 1) {
      psVar3 = (sat_solver *)p->pSat;
      iVar4 = Vec_IntEntry(p->vSatNumCis,local_28);
      iVar4 = sat_solver_var_value(psVar3,iVar4);
      if (iVar4 != 0) {
        Vec_IntPush(p->vCofVars,local_28);
      }
    }
    for (local_28 = 0; iVar4 = Gia_ManRegNum(p->pAig), local_28 < iVar4; local_28 = local_28 + 1) {
      iVar4 = Gia_StaHasValue0(pCur,local_28);
      if (iVar4 == 0) {
        iVar4 = Gia_StaHasValue1(pCur,local_28);
        if (iVar4 != 0) {
          psVar3 = (sat_solver *)p->pSat;
          pVVar1 = p->vSatNumCis;
          iVar4 = Gia_ManPiNum(p->pAig);
          iVar4 = Vec_IntEntry(pVVar1,iVar4 + local_28);
          iVar4 = sat_solver_var_value(psVar3,iVar4);
          if (iVar4 != 1) {
            __assert_fail("sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                          ,0x76b,
                          "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                         );
          }
        }
      }
      else {
        psVar3 = (sat_solver *)p->pSat;
        pVVar1 = p->vSatNumCis;
        iVar4 = Gia_ManPiNum(p->pAig);
        iVar4 = Vec_IntEntry(pVVar1,iVar4 + local_28);
        iVar4 = sat_solver_var_value(psVar3,iVar4);
        if (iVar4 != 0) {
          __assert_fail("sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEra2.c"
                        ,0x769,
                        "void Gia_ManAreDeriveCexSat(Gia_ManAre_t *, Gia_StaAre_t *, Gia_StaAre_t *, int)"
                       );
        }
      }
      psVar3 = (sat_solver *)p->pSat;
      pVVar1 = p->vSatNumCis;
      iVar4 = Gia_ManPiNum(p->pAig);
      iVar4 = Vec_IntEntry(pVVar1,iVar4 + local_28);
      iVar4 = sat_solver_var_value(psVar3,iVar4);
      if (iVar4 == 0) {
        Gia_StaSetValue0(pCur,local_28);
      }
      else {
        Gia_StaSetValue1(pCur,local_28);
      }
    }
  }
  else {
    printf("SAT problem is not satisfiable. Failure...\n");
  }
  return;
}

Assistant:

void Gia_ManAreDeriveCexSat( Gia_ManAre_t * p, Gia_StaAre_t * pCur, Gia_StaAre_t * pNext, int iOutFailed )
{
    int i, status;
    // make assuptions
    Vec_IntClear( p->vAssumps );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pCur, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i), 1 ) );
        else if ( Gia_StaHasValue1(pCur, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i), 0 ) );
    }
    if ( pNext )
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pNext, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, Gia_ManPoNum(p->pAig)+i), 1 ) );
        else if ( Gia_StaHasValue1(pNext, i) )
            Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, Gia_ManPoNum(p->pAig)+i), 0 ) );
    }
    if ( iOutFailed >= 0 )
    {
        assert( iOutFailed < Gia_ManPoNum(p->pAig) );
        Vec_IntPush( p->vAssumps, Abc_Var2Lit( Vec_IntEntry(p->vSatNumCos, iOutFailed), 0 ) );
    }
    // solve SAT
    status = sat_solver_solve( (sat_solver *)p->pSat, (int *)Vec_IntArray(p->vAssumps), (int *)Vec_IntArray(p->vAssumps) + Vec_IntSize(p->vAssumps), 
        (ABC_INT64_T)1000000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status != l_True )
    {
        printf( "SAT problem is not satisfiable. Failure...\n" );
        return;
    }
    assert( status == l_True );
    // check the model
    Vec_IntClear( p->vCofVars );
    for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
    {
        if ( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, i) ) )
            Vec_IntPush( p->vCofVars, i );
    }
    // write the current state
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( Gia_StaHasValue0(pCur, i) )
            assert( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0 );
        else if ( Gia_StaHasValue1(pCur, i) )
            assert( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 1 );
        // set don't-care value
        if ( sat_solver_var_value( (sat_solver *)p->pSat, Vec_IntEntry(p->vSatNumCis, Gia_ManPiNum(p->pAig)+i) ) == 0 )
            Gia_StaSetValue0( pCur, i );
        else
            Gia_StaSetValue1( pCur, i );
    }
}